

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int Quantize(void *hPtr,char *output,TrainingArgs trainArgs,char *label)

{
  undefined8 uVar1;
  TrainingArgs args_00;
  AutotuneArgs autotuneArgs;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  long in_RSI;
  undefined8 in_RDI;
  exception *e;
  Args args;
  string outPath;
  FastTextWrapper *fastText;
  undefined8 local_628;
  Args *in_stack_fffffffffffff9e0;
  Args *this;
  FastText *in_stack_fffffffffffff9e8;
  char *in_stack_fffffffffffffa00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  allocator<char> *in_stack_fffffffffffffa10;
  char *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa48;
  undefined1 caseInsensitive;
  string *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  undefined6 in_stack_fffffffffffffa98;
  byte in_stack_fffffffffffffa9e;
  undefined1 in_stack_fffffffffffffa9f;
  undefined7 in_stack_fffffffffffffab0;
  allocator<char> *paVar5;
  allocator<char> *paVar6;
  undefined4 in_stack_fffffffffffffad0;
  undefined8 *puVar7;
  undefined1 in_stack_fffffffffffffae0 [52];
  undefined1 in_stack_fffffffffffffb18 [24];
  TrainCallback *in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  FastText *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffc28;
  FastText *in_stack_fffffffffffffc30;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [32];
  string local_260 [32];
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  undefined4 local_1f8;
  allocator<char> local_1e1;
  string local_1e0 [196];
  int local_11c;
  undefined8 local_28;
  long local_18;
  undefined8 local_10;
  int local_4;
  
  caseInsensitive = (undefined1)((ulong)in_stack_fffffffffffffa48 >> 0x38);
  puVar7 = (undefined8 *)&stack0x00000008;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar2 = IsModelReady(in_stack_fffffffffffff9e0);
  if (bVar2) {
    local_28 = local_10;
    fasttext::FastText::getArgs(in_stack_fffffffffffff9e8);
    fasttext::Args::~Args(in_stack_fffffffffffff9e0);
    if (local_11c == 3) {
      if (local_18 == 0) {
        std::__cxx11::string::operator=((string *)&_lastError_abi_cxx11_,"Output is not specified!")
        ;
        local_4 = -1;
      }
      else {
        paVar6 = &local_1e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
        std::allocator<char>::~allocator(&local_1e1);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          paVar5 = &local_219;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
          bVar3 = EndsWith(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,(bool)caseInsensitive
                          );
          std::__cxx11::string::~string(local_218);
          std::allocator<char>::~allocator(&local_219);
          if ((bVar3 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10
                      );
            in_stack_fffffffffffffa9f =
                 EndsWith(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,(bool)caseInsensitive)
            ;
            in_stack_fffffffffffffa9e = in_stack_fffffffffffffa9f ^ 0xff;
            std::__cxx11::string::~string(local_280);
            std::allocator<char>::~allocator(&local_281);
            if ((in_stack_fffffffffffffa9e & 1) != 0) {
              std::operator+(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
              std::__cxx11::string::operator=(local_1e0,local_2a8);
              std::__cxx11::string::~string(local_2a8);
            }
          }
          else {
            std::__cxx11::string::length();
            std::__cxx11::string::substr((ulong)local_260,(ulong)local_1e0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9e8,(char *)in_stack_fffffffffffff9e0);
            std::__cxx11::string::operator=(local_1e0,local_240);
            std::__cxx11::string::~string(local_240);
            std::__cxx11::string::~string(local_260);
          }
          uVar1 = *puVar7;
          this = (Args *)puVar7[1];
          AutotuneArgs::AutotuneArgs((AutotuneArgs *)&stack0xfffffffffffffb30);
          args_00.lr._7_1_ = bVar3;
          args_00.lr._0_7_ = in_stack_fffffffffffffab0;
          args_00._8_8_ = paVar5;
          args_00.ws = (int)local_18;
          args_00.epoch = (int)((ulong)local_18 >> 0x20);
          args_00._24_8_ = paVar6;
          args_00.neg = in_stack_fffffffffffffad0;
          args_00.wordNgrams = local_11c;
          args_00._40_8_ = puVar7;
          args_00.bucket = in_stack_fffffffffffffae0._0_4_;
          args_00.minn = in_stack_fffffffffffffae0._4_4_;
          args_00.maxn = in_stack_fffffffffffffae0._8_4_;
          args_00.thread = in_stack_fffffffffffffae0._12_4_;
          args_00.t = (double)in_stack_fffffffffffffae0._16_8_;
          args_00.verbose = in_stack_fffffffffffffae0._24_4_;
          args_00.saveOutput = (bool)in_stack_fffffffffffffae0[0x1c];
          args_00.seed = in_stack_fffffffffffffae0._29_4_;
          args_00.qout = (bool)in_stack_fffffffffffffae0[0x21];
          args_00.retrain = (bool)in_stack_fffffffffffffae0[0x22];
          args_00.qnorm = (bool)in_stack_fffffffffffffae0[0x23];
          args_00.cutoff = in_stack_fffffffffffffae0._36_8_;
          args_00.dsub = in_stack_fffffffffffffae0._44_8_;
          autotuneArgs.modelSize = (char *)in_stack_fffffffffffffb30;
          autotuneArgs.validationFile = (char *)in_stack_fffffffffffffb18._0_8_;
          autotuneArgs.metric = (char *)in_stack_fffffffffffffb18._8_8_;
          autotuneArgs.predictions = in_stack_fffffffffffffb18._16_4_;
          autotuneArgs.duration = in_stack_fffffffffffffb18._20_4_;
          autotuneArgs.verbose = in_stack_fffffffffffffb38;
          local_628 = uVar1;
          CreateArgs(args_00,autotuneArgs,
                     (char *)CONCAT17(in_stack_fffffffffffffa9f,
                                      CONCAT16(in_stack_fffffffffffffa9e,in_stack_fffffffffffffa98))
                     ,(char *)&local_628);
          std::function<void_(float,_float,_double,_double,_long)>::function
                    ((function<void_(float,_float,_double,_double,_long)> *)this);
          fasttext::FastText::quantize
                    (in_stack_fffffffffffffb40,
                     (Args *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     in_stack_fffffffffffffb30);
          std::function<void_(float,_float,_double,_double,_long)>::~function
                    ((function<void_(float,_float,_double,_double,_long)> *)0x1f2b5d);
          fasttext::FastText::saveModel(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          local_4 = 0;
          local_1f8 = 1;
          fasttext::Args::~Args(this);
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)&_lastError_abi_cxx11_,"Output is not specified!");
          local_4 = -1;
          local_1f8 = 1;
        }
        std::__cxx11::string::~string(local_1e0);
      }
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&_lastError_abi_cxx11_,"Only supervised models can be quantized!");
      local_4 = -1;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&_lastError_abi_cxx11_,"Model is not ready!");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

Quantize(void* hPtr, const char* output, TrainingArgs trainArgs, const char* label)
{
    if (!IsModelReady(hPtr))
    {
        _lastError = "Model is not ready!";
        return -1;
    }

    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    if (fastText->getArgs().model != model_name::sup)
    {
        _lastError = "Only supervised models can be quantized!";
        return -1;
    }

    if (output == nullptr)
    {
        _lastError = "Output is not specified!";
        return -1;
    }

    auto outPath = std::string(output);
    if (outPath.empty())
    {
        _lastError = "Output is not specified!";
        return -1;
    }

    if (EndsWith(outPath, ".bin", true))
        outPath = outPath.substr(0, outPath.length() - 4) + ".ftz";
    else if (!EndsWith(outPath, ".ftz", true))
        outPath = outPath + ".ftz";

    auto args = CreateArgs(trainArgs, AutotuneArgs(), label, nullptr);

    try {
        fastText->quantize(args);
        fastText->saveModel(outPath);

        return 0;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}